

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (StaticInitializerVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__v;
  ExpressionKind EVar1;
  SymbolKind SVar2;
  size_t sVar3;
  pointer ppEVar4;
  SystemSubroutine *pSVar5;
  SourceLocation SVar6;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar7;
  pointer ppFVar8;
  optional<bool> oVar9;
  int iVar10;
  Symbol *this_00;
  Expression *pEVar11;
  Diagnostic *this_01;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar12;
  Diagnostic *this_02;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar13;
  long lVar14;
  pointer ppEVar15;
  VariableSymbol *var;
  bool bVar16;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (EVar1 - NamedValue < 2) {
    this_00 = Expression::getSymbolReference((Expression *)expr,true);
    if (this_00 != (Symbol *)0x0) {
      SVar2 = this_00->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_01 = ASTContext::addDiag(this->context,(DiagCode)0xf80006,
                                      (expr->super_AssignmentPatternExpressionBase).super_Expression
                                      .sourceRange);
LAB_0029a358:
        this_02 = Diagnostic::operator<<(this_01,this->sourceVar->name);
        Diagnostic::operator<<(this_02,this_00->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,this_00->location);
        return;
      }
      if ((SVar2 == Variable) && (this_00 != this->sourceVar)) {
        pEVar11 = DeclaredType::getInitializer((DeclaredType *)(this_00 + 1));
        bVar16 = this_00[5].name._M_len != 0;
        oVar9 = Symbol::isDeclaredBefore(this_00,this->sourceVar);
        if ((bVar16 || pEVar11 == (Expression *)0x0) ||
           ((((ushort)oVar9.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar9.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          this_01 = ASTContext::addDiag(this->context,
                                        (DiagCode)
                                        ((uint)(bVar16 || pEVar11 == (Expression *)0x0) * 0x10000 +
                                        0xf70006),
                                        (expr->super_AssignmentPatternExpressionBase).
                                        super_Expression.sourceRange);
          goto LAB_0029a358;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    __v = &(expr->super_AssignmentPatternExpressionBase).elements_;
    if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax == '\x01') {
      pvVar12 = std::
                get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)__v);
      ppEVar4 = expr[1].super_AssignmentPatternExpressionBase.elements_._M_ptr;
      if (ppEVar4 != (pointer)0x0) {
        pSVar5 = (pvVar12->subroutine).ptr;
        SVar6 = expr[1].super_AssignmentPatternExpressionBase.super_Expression.sourceRange.endLoc;
        ppEVar15 = (pointer)0x0;
        do {
          iVar10 = (*pSVar5->_vptr_SystemSubroutine[4])(pSVar5,ppEVar15);
          if ((char)iVar10 == '\0') {
            pEVar11 = *(Expression **)((long)SVar6 + (long)ppEVar15 * 8);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar11,pEVar11,this);
          }
          ppEVar15 = (pointer)((long)ppEVar15 + 1);
        } while (ppEVar4 != ppEVar15);
      }
    }
    else {
      ppSVar13 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)__v);
      pSVar7 = *ppSVar13;
      if ((pSVar7->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar7->super_Scope);
      }
      ppEVar4 = expr[1].super_AssignmentPatternExpressionBase.elements_._M_ptr;
      if (ppEVar4 != (pointer)0x0) {
        ppFVar8 = (pSVar7->arguments)._M_ptr;
        SVar6 = expr[1].super_AssignmentPatternExpressionBase.super_Expression.sourceRange.endLoc;
        ppEVar15 = (pointer)0x0;
        do {
          if (ppFVar8[(long)ppEVar15]->direction == In) {
            pEVar11 = *(Expression **)((long)SVar6 + (long)ppEVar15 * 8);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar11,pEVar11,this);
          }
          ppEVar15 = (pointer)((long)ppEVar15 + 1);
        } while (ppEVar4 != ppEVar15);
      }
    }
  }
  else if (EVar1 != NewCovergroup) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
              (expr->count_,expr->count_,this);
    sVar3 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
    if (sVar3 != 0) {
      ppEVar4 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar14 = 0;
      do {
        pEVar11 = *(Expression **)((long)ppEVar4 + lVar14);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                  (pEVar11,pEVar11,this);
        lVar14 = lVar14 + 8;
      } while (sVar3 << 3 != lVar14);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }